

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

IceTImage icetImageAssignBuffer(IceTVoid *buffer,IceTSizeType width,IceTSizeType height)

{
  IceTSizeType IVar1;
  undefined8 in_RAX;
  IceTEnum depth_format_00;
  IceTEnum color_format_00;
  IceTEnum depth_format;
  IceTEnum color_format;
  
  if (buffer == (IceTVoid *)0x0) {
    icetRaiseDiagnostic("Tried to create image with NULL buffer.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x144);
  }
  else {
    _depth_format = in_RAX;
    icetGetEnumv(9,&color_format);
    icetGetEnumv(10,&depth_format);
    color_format_00 = color_format;
    if (color_format - 0xc003 < 0xfffffffd) {
      icetRaiseDiagnostic("Invalid color format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x150);
      _depth_format = CONCAT44(0xc000,depth_format);
      color_format_00 = 0xc000;
    }
    depth_format_00 = depth_format;
    if (depth_format - 0xd002 < 0xfffffffe) {
      icetRaiseDiagnostic("Invalid depth format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x155);
      _depth_format = CONCAT44(color_format,0xd000);
      depth_format_00 = 0xd000;
      color_format_00 = color_format;
    }
    *(undefined4 *)buffer = 0x4d5000;
    *(IceTEnum *)((long)buffer + 4) = color_format_00;
    *(IceTEnum *)((long)buffer + 8) = depth_format_00;
    *(IceTSizeType *)((long)buffer + 0xc) = width;
    *(IceTSizeType *)((long)buffer + 0x10) = height;
    *(IceTSizeType *)((long)buffer + 0x14) = height * width;
    IVar1 = icetImageBufferSizeType(color_format_00,depth_format_00,width,height);
    *(IceTSizeType *)((long)buffer + 0x18) = IVar1;
  }
  return (IceTImage)buffer;
}

Assistant:

IceTImage icetImageAssignBuffer(IceTVoid *buffer,
                                IceTSizeType width,
                                IceTSizeType height)
{
    IceTImage image;
    IceTEnum color_format, depth_format;
    IceTInt *header;

    image.opaque_internals = buffer;

    if (buffer == NULL) {
        icetRaiseError("Tried to create image with NULL buffer.",
                       ICET_INVALID_VALUE);
        return icetImageNull();
    }

    icetGetEnumv(ICET_COLOR_FORMAT, &color_format);
    icetGetEnumv(ICET_DEPTH_FORMAT, &depth_format);

    header = ICET_IMAGE_HEADER(image);

    if (   (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE)
        && (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT)
        && (color_format != ICET_IMAGE_COLOR_NONE) ) {
        icetRaiseError("Invalid color format.", ICET_INVALID_ENUM);
        color_format = ICET_IMAGE_COLOR_NONE;
    }
    if (   (depth_format != ICET_IMAGE_DEPTH_FLOAT)
        && (depth_format != ICET_IMAGE_DEPTH_NONE) ) {
        icetRaiseError("Invalid depth format.", ICET_INVALID_ENUM);
        depth_format = ICET_IMAGE_DEPTH_NONE;
    }

    header[ICET_IMAGE_MAGIC_NUM_INDEX]          = ICET_IMAGE_MAGIC_NUM;
    header[ICET_IMAGE_COLOR_FORMAT_INDEX]       = color_format;
    header[ICET_IMAGE_DEPTH_FORMAT_INDEX]       = depth_format;
    header[ICET_IMAGE_WIDTH_INDEX]              = (IceTInt)width;
    header[ICET_IMAGE_HEIGHT_INDEX]             = (IceTInt)height;
    header[ICET_IMAGE_MAX_NUM_PIXELS_INDEX]     = (IceTInt)(width*height);
    header[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX]
        = (IceTInt)icetImageBufferSizeType(color_format,
                                           depth_format,
                                           width,
                                           height);

    return image;
}